

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ViaCoroutine.h
# Opt level: O0

ValueAwaiter
async_simple::coro::detail::
coAwait<async_simple::coro::Lazy<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>>>
          (Executor *ex,
          Lazy<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
          *awaitable)

{
  Lazy<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
  *in_RDX;
  Handle in_RDI;
  Executor *in_stack_ffffffffffffffe0;
  
  Lazy<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
  ::coAwait(in_RDX,in_stack_ffffffffffffffe0);
  getAwaiter<async_simple::coro::detail::LazyBase<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,false>::ValueAwaiter>
            ((ValueAwaiter *)in_RDI.__handle_);
  LazyBase<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_false>
  ::ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x2e37a3);
  return (ValueAwaiter)(Handle)in_RDI.__handle_;
}

Assistant:

inline auto coAwait(Executor* ex, Awaitable&& awaitable) {
    if constexpr (detail::HasCoAwaitMethod<Awaitable>) {
        return detail::getAwaiter(
            std::forward<Awaitable>(awaitable).coAwait(ex));
    } else {
        using AwaiterType =
            decltype(detail::getAwaiter(std::forward<Awaitable>(awaitable)));
        return ViaAsyncAwaiter<std::decay_t<AwaiterType>>(
            ex, std::forward<Awaitable>(awaitable));
    }
}